

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statistics.h
# Opt level: O0

void __thiscall CompilerStatistics::CompilerStatistics(CompilerStatistics *this)

{
  Timer local_2a0;
  Timer local_278;
  Timer local_250;
  Timer local_228;
  Timer local_200;
  Timer local_1d8;
  Timer local_1b0;
  Timer local_188;
  Timer local_160;
  Timer local_138;
  Timer local_110;
  Timer local_e8;
  Timer local_c0;
  Timer local_98;
  Timer local_70;
  Timer local_38;
  CompilerStatistics *local_10;
  CompilerStatistics *this_local;
  
  local_10 = this;
  SmallArray<CompilerStatistics::Timer,_16U>::SmallArray(&this->timers,(Allocator *)0x0);
  this->startTime = 0;
  this->finishTime = 0;
  Timer::Timer(&local_38,"Lexer","lexer");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(&this->timers,&local_38);
  Timer::Timer(&local_70,"Parse","parse");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(&this->timers,&local_70);
  Timer::Timer(&local_98,"Import","import");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(&this->timers,&local_98);
  Timer::Timer(&local_c0,"Expressions","analyze");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(&this->timers,&local_c0);
  Timer::Timer(&local_e8,"Finalization","(finalize)");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(&this->timers,&local_e8);
  Timer::Timer(&local_110,"Cleanup","(cleanup)");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(&this->timers,&local_110);
  Timer::Timer(&local_138,"IrCodeGen","codegen");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(&this->timers,&local_138);
  Timer::Timer(&local_160,"LlvmCodeGen","llvm");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(&this->timers,&local_160);
  Timer::Timer(&local_188,"IrOptimization","optimization");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(&this->timers,&local_188);
  Timer::Timer(&local_1b0,"IrFinalization","(finalize)");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(&this->timers,&local_1b0);
  Timer::Timer(&local_1d8,"IrLowering","lower");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(&this->timers,&local_1d8);
  Timer::Timer(&local_200,"Bytecode","bytecode");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(&this->timers,&local_200);
  Timer::Timer(&local_228,"BytecodeCache","(cache)");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(&this->timers,&local_228);
  Timer::Timer(&local_250,"Logging","logs");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(&this->timers,&local_250);
  Timer::Timer(&local_278,"Tracing","trace");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(&this->timers,&local_278);
  Timer::Timer(&local_2a0,"Extra","extra");
  SmallArray<CompilerStatistics::Timer,_16U>::push_back(&this->timers,&local_2a0);
  return;
}

Assistant:

CompilerStatistics()
	{
		startTime = 0;
		finishTime = 0;

		timers.push_back(Timer("Lexer", "lexer"));
		timers.push_back(Timer("Parse", "parse"));

		timers.push_back(Timer("Import", "import"));
		timers.push_back(Timer("Expressions", "analyze"));
		timers.push_back(Timer("Finalization", "(finalize)"));
		timers.push_back(Timer("Cleanup", "(cleanup)"));

		timers.push_back(Timer("IrCodeGen", "codegen"));
		timers.push_back(Timer("LlvmCodeGen", "llvm"));
		timers.push_back(Timer("IrOptimization", "optimization"));
		timers.push_back(Timer("IrFinalization", "(finalize)"));
		timers.push_back(Timer("IrLowering", "lower"));
		timers.push_back(Timer("Bytecode", "bytecode"));
		timers.push_back(Timer("BytecodeCache", "(cache)"));

		timers.push_back(Timer("Logging", "logs"));
		timers.push_back(Timer("Tracing", "trace"));
		timers.push_back(Timer("Extra", "extra"));
	}